

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::Array<char>_> *
kj::parse::Many_<const_kj::parse::CharGroup__&,_true>::
Impl<capnp::compiler::Lexer::ParserInput,_char>::apply
          (Maybe<kj::Array<char>_> *__return_storage_ptr__,CharGroup_ *subParser,ParserInput *input)

{
  bool bVar1;
  NullableValue<char> *other;
  char *pcVar2;
  Array<char> local_a0;
  int local_84;
  char *local_80;
  char *subResult;
  NullableValue<char> _subResult425;
  undefined1 local_68 [8];
  ParserInput subInput;
  Results results;
  ParserInput *input_local;
  CharGroup_ *subParser_local;
  
  Vector<char>::Vector((Vector<char> *)&subInput.begin);
  do {
    bVar1 = IteratorInput<char,_const_char_*>::atEnd
                      (&input->super_IteratorInput<char,_const_char_*>);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ::capnp::compiler::Lexer::ParserInput::ParserInput((ParserInput *)local_68,input);
    CharGroup_::operator()((CharGroup_ *)&subResult,(ParserInput *)subParser);
    other = kj::_::readMaybe<char>((Maybe<char> *)&subResult);
    kj::_::NullableValue<char>::NullableValue((NullableValue<char> *)((long)&subResult + 2),other);
    Maybe<char>::~Maybe((Maybe<char> *)&subResult);
    pcVar2 = kj::_::NullableValue::operator_cast_to_char_((NullableValue *)((long)&subResult + 2));
    if (pcVar2 == (char *)0x0) {
      local_84 = 3;
    }
    else {
      local_80 = kj::_::NullableValue<char>::operator*
                           ((NullableValue<char> *)((long)&subResult + 2));
      IteratorInput<char,_const_char_*>::advanceParent
                ((IteratorInput<char,_const_char_*> *)local_68);
      pcVar2 = mv<char>(local_80);
      Vector<char>::add<char>((Vector<char> *)&subInput.begin,pcVar2);
      local_84 = 0;
    }
    kj::_::NullableValue<char>::~NullableValue((NullableValue<char> *)((long)&subResult + 2));
    if (local_84 == 0) {
      local_84 = 0;
    }
    ::capnp::compiler::Lexer::ParserInput::~ParserInput((ParserInput *)local_68);
  } while (local_84 == 0);
  bVar1 = Vector<char>::empty((Vector<char> *)&subInput.begin);
  if (bVar1) {
    Maybe<kj::Array<char>_>::Maybe(__return_storage_ptr__);
  }
  else {
    Vector<char>::releaseAsArray(&local_a0,(Vector<char> *)&subInput.begin);
    Maybe<kj::Array<char>_>::Maybe(__return_storage_ptr__,&local_a0);
    Array<char>::~Array(&local_a0);
  }
  local_84 = 1;
  Vector<char>::~Vector((Vector<char> *)&subInput.begin);
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }